

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InterfacePortSymbol *symbol)

{
  flat_hash_set<const_DefinitionSymbol_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  DefinitionSymbol *pDVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppDVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  ulong pos0;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> sVar11;
  ulong hash;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  undefined1 auVar20 [16];
  IfaceConn IVar21;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
  sVar22;
  locator res;
  _Storage<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true> local_48;
  
  bVar10 = handleDefault<slang::ast::InterfacePortSymbol>(this,symbol);
  if (bVar10) {
    InterfacePortSymbol::getDeclaredRange
              ((optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *)
               &local_48._M_value,symbol);
    pDVar4 = symbol->interfaceDef;
    if (pDVar4 != (DefinitionSymbol *)0x0) {
      arrays_ = &this->usedIfacePorts;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = pDVar4;
      hash = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
      pos0 = hash >> ((byte)(this->usedIfacePorts).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                            .arrays.groups_size_index & 0x3f);
      pgVar5 = (this->usedIfacePorts).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               .arrays.groups_;
      uVar3 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[hash & 0xff];
      ppDVar6 = (this->usedIfacePorts).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                .arrays.elements_;
      uVar7 = (this->usedIfacePorts).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              .arrays.groups_size_mask;
      uVar13 = 0;
      uVar15 = pos0;
      do {
        pgVar2 = pgVar5 + uVar15;
        uVar16 = (uchar)uVar3;
        auVar20[0] = -(pgVar2->m[0].n == uVar16);
        uVar17 = (uchar)((uint)uVar3 >> 8);
        auVar20[1] = -(pgVar2->m[1].n == uVar17);
        uVar18 = (uchar)((uint)uVar3 >> 0x10);
        auVar20[2] = -(pgVar2->m[2].n == uVar18);
        uVar19 = (uchar)((uint)uVar3 >> 0x18);
        auVar20[3] = -(pgVar2->m[3].n == uVar19);
        auVar20[4] = -(pgVar2->m[4].n == uVar16);
        auVar20[5] = -(pgVar2->m[5].n == uVar17);
        auVar20[6] = -(pgVar2->m[6].n == uVar18);
        auVar20[7] = -(pgVar2->m[7].n == uVar19);
        auVar20[8] = -(pgVar2->m[8].n == uVar16);
        auVar20[9] = -(pgVar2->m[9].n == uVar17);
        auVar20[10] = -(pgVar2->m[10].n == uVar18);
        auVar20[0xb] = -(pgVar2->m[0xb].n == uVar19);
        auVar20[0xc] = -(pgVar2->m[0xc].n == uVar16);
        auVar20[0xd] = -(pgVar2->m[0xd].n == uVar17);
        auVar20[0xe] = -(pgVar2->m[0xe].n == uVar18);
        auVar20[0xf] = -(pgVar2->m[0xf].n == uVar19);
        for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
            uVar12 = uVar12 - 1 & uVar12) {
          uVar8 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          if (pDVar4 == ppDVar6[uVar15 * 0xf + (ulong)uVar8]) {
            if (ppDVar6 + uVar15 * 0xf + (ulong)uVar8 != (value_type_pointer)0x0) goto LAB_002f7632;
            goto LAB_002f75fe;
          }
        }
        if ((pgVar5[uVar15].m[0xf].n &
            (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
        lVar14 = uVar15 + uVar13;
        uVar13 = uVar13 + 1;
        uVar15 = lVar14 + 1U & uVar7;
      } while (uVar13 <= uVar7);
LAB_002f75fe:
      if ((this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.size <
          (this->usedIfacePorts).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::nosize_unchecked_emplace_at<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_48._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)arrays_,(arrays_type *)arrays_,pos0,hash,&symbol->interfaceDef);
        psVar1 = &(this->usedIfacePorts).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
        ::unchecked_emplace_with_rehash<slang::ast::DefinitionSymbol_const*const&>
                  ((locator *)&local_48._M_value,
                   (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                    *)arrays_,hash,&symbol->interfaceDef);
      }
LAB_002f7632:
      if ((symbol->modport)._M_len != 0) {
        IVar21 = InterfacePortSymbol::getConnection(symbol);
        local_48._M_value._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)IVar21.second;
        if (local_48._M_value._M_extent._M_extent_value != 0) {
          sVar22 = Scope::membersOfType<slang::ast::MethodPrototypeSymbol>
                             ((Scope *)((long)local_48._M_value._M_extent._M_extent_value + 0x40));
          sVar11 = sVar22._M_begin.current;
LAB_002f7652:
          if (sVar11.current != sVar22._M_end.current.current) {
            if ((sVar11.current[3].kind & Subroutine) != Unknown) {
              local_48._M_value._M_ptr = (pointer)symbol;
              SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
              ::
              emplace_back<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                        ((SmallVectorBase<std::pair<slang::ast::InterfacePortSymbol_const*,slang::ast::ModportSymbol_const*>>
                          *)&this->modportsWithExports,
                         (pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>
                          *)&local_48._M_value);
              return;
            }
            do {
              sVar11.current = (sVar11.current)->nextInScope;
              if (sVar11.current == (Symbol *)0x0) break;
            } while ((sVar11.current)->kind != MethodPrototype);
            goto LAB_002f7652;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const InterfacePortSymbol& symbol) {
        if (!handleDefault(symbol))
            return;
        symbol.getDeclaredRange();

        if (symbol.interfaceDef) {
            usedIfacePorts.emplace(symbol.interfaceDef);

            // If this interface port specifies a modport and that
            // modport has export methods, store it in a list for later
            // processing and checking.
            if (!symbol.modport.empty()) {
                auto [_, modport] = symbol.getConnection();
                if (modport) {
                    for (auto& method : modport->membersOfType<MethodPrototypeSymbol>()) {
                        if (method.flags.has(MethodFlags::ModportExport)) {
                            modportsWithExports.push_back({&symbol, modport});
                            break;
                        }
                    }
                }
            }
        }
    }